

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

RTCGeometry rtcGetGeometry(RTCScene hscene,uint geomID)

{
  return *(RTCGeometry *)(*(long *)(hscene + 0x1e8) + (ulong)geomID * 8);
}

Assistant:

RTC_API RTCGeometry rtcGetGeometry (RTCScene hscene, unsigned int geomID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetGeometry);
#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_GEOMID(geomID);
#endif
    //RTC_ENTER_DEVICE(hscene); // do not enable for performance reasons
    return (RTCGeometry) scene->get(geomID);
    RTC_CATCH_END2(scene);
    return nullptr;
  }